

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

vector<duckdb::LogicalType,_true> * duckdb::LogicalType::Numeric(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_151;
  LogicalType local_150 [4];
  LogicalType local_f0;
  LogicalType local_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType(local_150,TINYINT);
  LogicalType(local_150 + 1,SMALLINT);
  LogicalType(local_150 + 2,INTEGER);
  LogicalType(local_150 + 3,BIGINT);
  LogicalType(&local_f0,HUGEINT);
  LogicalType(&local_d8,FLOAT);
  LogicalType(&local_c0,DOUBLE);
  LogicalType(&local_a8,DECIMAL);
  LogicalType(&local_90,UTINYINT);
  LogicalType(&local_78,USMALLINT);
  LogicalType(&local_60,UINTEGER);
  LogicalType(&local_48,UBIGINT);
  LogicalType(&local_30,UHUGEINT);
  __l._M_len = 0xd;
  __l._M_array = local_150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_151);
  lVar1 = 0x120;
  do {
    ~LogicalType((LogicalType *)(&local_150[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

const vector<LogicalType> LogicalType::Numeric() {
	vector<LogicalType> types = {LogicalType::TINYINT,   LogicalType::SMALLINT,  LogicalType::INTEGER,
	                             LogicalType::BIGINT,    LogicalType::HUGEINT,   LogicalType::FLOAT,
	                             LogicalType::DOUBLE,    LogicalTypeId::DECIMAL, LogicalType::UTINYINT,
	                             LogicalType::USMALLINT, LogicalType::UINTEGER,  LogicalType::UBIGINT,
	                             LogicalType::UHUGEINT};
	return types;
}